

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

void icu_63::number::impl::AffixUtils::iterateWithConsumer
               (UnicodeString *affixPattern,TokenConsumer *consumer,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UErrorCode *in_R8;
  AffixTag AVar4;
  AffixUtils *local_40;
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  AffixTag tag;
  UErrorCode *status_local;
  TokenConsumer *consumer_local;
  UnicodeString *affixPattern_local;
  
  tag._8_8_ = status;
  iVar3 = UnicodeString::length(affixPattern);
  if (iVar3 != 0) {
    AffixTag::AffixTag((AffixTag *)local_30);
    do {
      bVar1 = hasNext((AffixTag *)local_30,affixPattern);
      if (!bVar1) {
        return;
      }
      AVar4._8_8_ = affixPattern;
      AVar4.offset = tag.offset;
      AVar4.codePoint = tag.codePoint;
      AVar4 = nextToken((AffixUtils *)local_30,AVar4,(UnicodeString *)tag._8_8_,in_R8);
      local_40 = AVar4._0_8_;
      local_30 = (undefined1  [8])local_40;
      local_38 = AVar4._8_8_;
      tag.offset = local_38._0_4_;
      tag.codePoint = local_38._4_4_;
      UVar2 = ::U_FAILURE(*(UErrorCode *)tag._8_8_);
      if (UVar2 != '\0') {
        return;
      }
      (*consumer->_vptr_TokenConsumer[2])
                (consumer,(ulong)tag._0_8_ >> 0x20,(ulong)local_30 >> 0x20,tag._8_8_);
      UVar2 = ::U_FAILURE(*(UErrorCode *)tag._8_8_);
    } while (UVar2 == '\0');
  }
  return;
}

Assistant:

void AffixUtils::iterateWithConsumer(const UnicodeString& affixPattern, TokenConsumer& consumer,
                                     UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return; }
        consumer.consumeToken(tag.type, tag.codePoint, status);
        if (U_FAILURE(status)) { return; }
    }
}